

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t despace_ssse3_cumsum(void *dst_void,void *src_void,size_t length)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  byte bVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t sVar7;
  undefined8 *dst_void_00;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  auVar6 = _DAT_00195190;
  auVar5 = _DAT_00195160;
  auVar11[8] = 0x20;
  auVar11._0_8_ = 0x2020202020202020;
  auVar11[9] = 0x20;
  auVar11[10] = 0x20;
  auVar11[0xb] = 0x20;
  auVar11[0xc] = 0x20;
  auVar11[0xd] = 0x20;
  auVar11[0xe] = 0x20;
  auVar11[0xf] = 0x20;
  auVar12[8] = 1;
  auVar12._0_8_ = 0x101010101010101;
  auVar12[9] = 1;
  auVar12[10] = 1;
  auVar12[0xb] = 1;
  auVar12[0xc] = 1;
  auVar12[0xd] = 1;
  auVar12[0xe] = 1;
  auVar12[0xf] = 1;
  auVar13[8] = 0x70;
  auVar13._0_8_ = 0x7070707070707070;
  auVar13[9] = 0x70;
  auVar13[10] = 0x70;
  auVar13[0xb] = 0x70;
  auVar13[0xc] = 0x70;
  auVar13[0xd] = 0x70;
  auVar13[0xe] = 0x70;
  auVar13[0xf] = 0x70;
  auVar14[8] = 3;
  auVar14._0_8_ = 0x303030303030303;
  auVar14[9] = 3;
  auVar14[10] = 3;
  auVar14[0xb] = 3;
  auVar14[0xc] = 3;
  auVar14[0xd] = 3;
  auVar14[0xe] = 3;
  auVar14[0xf] = 3;
  auVar15[8] = 4;
  auVar15._0_8_ = 0x404040404040404;
  auVar15[9] = 4;
  auVar15[10] = 4;
  auVar15[0xb] = 4;
  auVar15[0xc] = 4;
  auVar15[0xd] = 4;
  auVar15[0xe] = 4;
  auVar15[0xf] = 4;
  auVar16._8_8_ = 0x1010101010101;
  auVar16._0_8_ = 0x1010101010101;
  dst_void_00 = (undefined8 *)dst_void;
  while (0xf < length) {
    auVar1 = *src_void;
    src_void = (void *)((long)src_void + 0x10);
    length = length - 0x10;
    auVar9 = vpaddusb_avx(auVar1,auVar13);
    auVar17 = vpcmpeqb_avx(auVar1,auVar11);
    auVar9 = vpshufb_avx(auVar5,auVar9);
    auVar9 = vpternlogq_avx512vl(auVar9,auVar17,auVar12,0xf8);
    auVar17 = vpsllq_avx(auVar9,8);
    uVar4 = vptestmb_avx512vl(auVar9,auVar9);
    auVar9 = vpaddb_avx(auVar9,auVar17);
    auVar17 = vpsllq_avx(auVar9,0x10);
    auVar9 = vpaddb_avx(auVar9,auVar17);
    auVar17 = vpsllq_avx(auVar9,0x20);
    auVar9 = vpaddb_avx(auVar9,auVar17);
    auVar10 = vmovdqu8_avx512vl(auVar9);
    auVar17[1] = ((byte)(uVar4 >> 1) & 1) * auVar10[1];
    auVar17[0] = ((byte)uVar4 & 1) * auVar10[0];
    auVar17[2] = ((byte)(uVar4 >> 2) & 1) * auVar10[2];
    auVar17[3] = ((byte)(uVar4 >> 3) & 1) * auVar10[3];
    auVar17[4] = ((byte)(uVar4 >> 4) & 1) * auVar10[4];
    auVar17[5] = ((byte)(uVar4 >> 5) & 1) * auVar10[5];
    auVar17[6] = ((byte)(uVar4 >> 6) & 1) * auVar10[6];
    auVar17[7] = ((byte)(uVar4 >> 7) & 1) * auVar10[7];
    auVar17[8] = ((byte)(uVar4 >> 8) & 1) * auVar10[8];
    auVar17[9] = ((byte)(uVar4 >> 9) & 1) * auVar10[9];
    auVar17[10] = ((byte)(uVar4 >> 10) & 1) * auVar10[10];
    auVar17[0xb] = ((byte)(uVar4 >> 0xb) & 1) * auVar10[0xb];
    auVar17[0xc] = ((byte)(uVar4 >> 0xc) & 1) * auVar10[0xc];
    auVar17[0xd] = ((byte)(uVar4 >> 0xd) & 1) * auVar10[0xd];
    auVar17[0xe] = ((byte)(uVar4 >> 0xe) & 1) * auVar10[0xe];
    auVar17[0xf] = (char)(uVar4 >> 0xf) * auVar10[0xf];
    auVar10 = vpshufb_avx(ZEXT816(0x100000001000000),auVar17);
    auVar18 = vpsrlq_avx(auVar17,9);
    uVar8 = vpcmpb_avx512vl(auVar17,auVar15,4);
    bVar3 = auVar9[7];
    auVar17 = vpand_avx(auVar18,auVar16);
    uVar4 = vpcmpgtb_avx512vl(auVar9,auVar14);
    uVar8 = uVar8 & uVar4;
    auVar10 = vpsrlq_avx(auVar10,0x10);
    auVar9 = vpaddb_avx(auVar9,auVar10);
    auVar9 = vpaddb_avx(auVar9,auVar17);
    auVar17 = vmovdqu8_avx512vl(auVar9);
    auVar10[1] = ((byte)(uVar8 >> 1) & 1) * auVar17[1];
    auVar10[0] = ((byte)uVar8 & 1) * auVar17[0];
    auVar10[2] = ((byte)(uVar8 >> 2) & 1) * auVar17[2];
    auVar10[3] = ((byte)(uVar8 >> 3) & 1) * auVar17[3];
    auVar10[4] = ((byte)(uVar8 >> 4) & 1) * auVar17[4];
    auVar10[5] = ((byte)(uVar8 >> 5) & 1) * auVar17[5];
    auVar10[6] = ((byte)(uVar8 >> 6) & 1) * auVar17[6];
    auVar10[7] = ((byte)(uVar8 >> 7) & 1) * auVar17[7];
    auVar10[8] = ((byte)(uVar8 >> 8) & 1) * auVar17[8];
    auVar10[9] = ((byte)(uVar8 >> 9) & 1) * auVar17[9];
    auVar10[10] = ((byte)(uVar8 >> 10) & 1) * auVar17[10];
    auVar10[0xb] = ((byte)(uVar8 >> 0xb) & 1) * auVar17[0xb];
    auVar10[0xc] = ((byte)(uVar8 >> 0xc) & 1) * auVar17[0xc];
    auVar10[0xd] = ((byte)(uVar8 >> 0xd) & 1) * auVar17[0xd];
    auVar10[0xe] = ((byte)(uVar8 >> 0xe) & 1) * auVar17[0xe];
    auVar10[0xf] = (char)(uVar8 >> 0xf) * auVar17[0xf];
    auVar17 = vpsrlq_avx(auVar10,0x20);
    auVar9 = vpmaxub_avx(auVar9,auVar17);
    auVar9 = vpaddb_avx(auVar9,auVar6);
    auVar1 = vpshufb_avx(auVar1,auVar9);
    *dst_void_00 = auVar1._0_8_;
    uVar2 = vpextrq_avx(auVar1,1);
    *(undefined8 *)((long)dst_void_00 + (8 - (ulong)bVar3)) = uVar2;
    dst_void_00 = (undefined8 *)((long)dst_void_00 + (-(ulong)bVar3 - (ulong)bVar3) + 0x10);
  }
  sVar7 = despace_branchless(dst_void_00,src_void,length);
  return (long)dst_void_00 + (sVar7 - (long)dst_void);
}

Assistant:

size_t despace_ssse3_cumsum( void* dst_void, void* src_void, size_t length )
{
	uint8_t* src = (uint8_t*)src_void;
	uint8_t* dst = (uint8_t*)dst_void;

	const __m128i is_3or7 = _mm_setr_epi8(
		0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00, 0x01,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00);
	const __m128i lut_cntrl = _mm_setr_epi8(
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x01, 0x01, 0x00, 0x00, 0x01, 0x00, 0x00);
	const __m128i id = _mm_setr_epi8(
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07,
		0x08, 0x09, 0x0A, 0x0B, 0x0C, 0x0D, 0x0E, 0x0F);
	const __m128i mask_02 = _mm_set1_epi8(0x02);
	const __m128i mask_04 = _mm_add_epi8(mask_02, mask_02);
	const __m128i mask_20 = _mm_slli_epi64(mask_02, 4);
	const __m128i mask_70 = _mm_set1_epi8(0x70);

	for( ; length >= 16; length-=16 ){
		__m128i a,b,c,d,s,t,v;
		size_t cnt0, cnt1;

		// load
		v = _mm_loadu_si128((__m128i*)src);
		src += 16;

		// detect spaces ( 0x01 == space, 0x00 == non-space )
		s = _mm_or_si128(_mm_abs_epi8(_mm_cmpeq_epi8(mask_20, v)),
			_mm_shuffle_epi8(lut_cntrl, _mm_adds_epu8(mask_70, v)));

		// create non-space mask ( 0x00 == space, 0xFF == non-space )
		b = _mm_cmpeq_epi8(_mm_setzero_si128(), s);

		// (qword) prefix sum of spaces
		s = _mm_add_epi8(s, _mm_slli_epi64(s, 8));
		s = _mm_add_epi8(s, _mm_slli_epi64(s, 16));
		s = _mm_add_epi8(s, _mm_slli_epi64(s, 32));

		// get non-space byte totals
		t = _mm_srli_epi64(s, 56); // hi-byte is total_spaces
		cnt0 = 8 - _mm_cvtsi128_si64(t);
		t = _mm_unpackhi_epi64(t, t);
		cnt1 = 8 - _mm_cvtsi128_si64(t);

		// compress
		b = _mm_andnot_si128(b, s); // zero non-spaces
		//
		c = _mm_srli_epi64(_mm_and_si128(mask_02, b), 9);
		d = _mm_srli_epi64(_mm_shuffle_epi8(is_3or7, b), 16);
		a = _mm_or_si128(_mm_cmpgt_epi8(mask_04, s), _mm_cmpeq_epi8(b, mask_04)); // match first 4 and below
		//
		s = _mm_add_epi8(s, c);
		s = _mm_add_epi8(s, d);
		//
		s = _mm_max_epu8(s, _mm_srli_epi64(_mm_andnot_si128(a, s), 32));
		v = _mm_shuffle_epi8(v, _mm_add_epi8(s, id));

		// store
		_mm_storel_epi64((__m128i*)dst, v);
		dst += cnt0;
		_mm_storel_epi64((__m128i*)dst, _mm_unpackhi_epi64(v, v));
		dst += cnt1;
	}
	dst += despace_branchless(dst, src, length);
	return (size_t)(dst - ((uint8_t*)dst_void));
}